

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O1

size_t __thiscall remote::Handle::GetModuleAddress(Handle *this,string *name)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  pointer pRVar5;
  Region reg;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  size_t local_d8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [24];
  vector<remote::Region,_std::allocator<remote::Region>_> local_48;
  
  bVar3 = IsRunning(this);
  if (bVar3) {
    remote::GetRegions(&local_48,this->pid);
    bVar3 = local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (!bVar3) {
      pRVar5 = local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        sVar2 = pRVar5->start;
        local_90[0] = local_80;
        pcVar1 = (pRVar5->pathname)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar1,pcVar1 + (pRVar5->pathname)._M_string_length);
        pcVar1 = (pRVar5->filename)._M_dataplus._M_p;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar1,pcVar1 + (pRVar5->filename)._M_string_length);
        iVar4 = std::__cxx11::string::compare((string *)local_70);
        if (iVar4 == 0) {
          local_d8 = sVar2;
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if (iVar4 == 0) break;
        pRVar5 = pRVar5 + 1;
        bVar3 = pRVar5 == local_48.
                          super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar3);
    }
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_48);
    if (!bVar3) {
      return local_d8;
    }
  }
  return 0;
}

Assistant:

size_t Handle::GetModuleAddress(string name) {
    if(IsRunning()) {
        vector<Region> regions = GetRegions();

        // These are ordered by memory start in maps
        // So first result is fine
        for(auto reg : regions) {
            if(reg.filename.compare(name) == 0) {
                return reg.start;
            }
        }
    }

    return 0;
}